

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Finder *pFVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Type TVar8;
  undefined4 extraout_var;
  Descriptor *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ExtensionRange *pEVar9;
  undefined4 extraout_var_03;
  FieldDescriptor *this_01;
  undefined4 extraout_var_04;
  long *plVar10;
  Descriptor *pDVar11;
  FieldDescriptor *this_02;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 *puVar12;
  LogMessage *other;
  undefined8 *puVar13;
  ulong *puVar14;
  size_type *psVar15;
  char *pcVar16;
  ulong *puVar17;
  _Alloc_hider _Var18;
  string full_type_name;
  string prefix;
  string serialized_value;
  string field_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  int32 field_number;
  undefined1 local_148 [56];
  string local_110;
  string local_f0;
  Reflection *local_d0;
  string local_c8;
  string local_a8;
  FieldDescriptor *local_88;
  FieldDescriptor *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ParseLocation local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_00;
  
  iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  local_d0 = (Reflection *)CONCAT44(extraout_var,iVar7);
  iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  this_00 = (Descriptor *)CONCAT44(extraout_var_00,iVar7);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_58.line = (this->tokenizer_).current_.line;
  local_58.column = (this->tokenizer_).current_.column;
  bVar5 = internal::GetAnyFieldDescriptors(message,&local_80,&local_88);
  local_148._0_8_ = local_148 + 0x10;
  if (bVar5) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"[","");
    bVar5 = TryConsume(this,(string *)local_148);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    local_148._0_8_ = local_148 + 0x10;
    if (bVar5) {
      local_148._8_8_ = (char *)0x0;
      local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
      local_110._M_string_length = 0;
      local_110.field_2._M_allocated_capacity =
           local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      bVar5 = ConsumeAnyTypeUrl(this,(string *)local_148,&local_110);
      if (bVar5) {
        paVar1 = &local_f0.field_2;
        local_f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"]","");
        bVar5 = Consume(this,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (!bVar5) goto LAB_00332fbc;
        local_f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,":","");
        TryConsume(this,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        local_f0._M_string_length = 0;
        local_f0.field_2._M_allocated_capacity =
             local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_f0._M_dataplus._M_p = (pointer)paVar1;
        iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
        bVar5 = ConsumeAnyValue(this,(string *)local_148,
                                *(DescriptorPool **)
                                 (*(long *)(CONCAT44(extraout_var_01,iVar7) + 0x10) + 0x10),
                                &local_f0);
        if (bVar5) {
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((*(int *)(local_80 + 0x4c) != 3 &&
               (iVar7 = (*local_d0->_vptr_Reflection[5])(local_d0,message), (char)iVar7 != '\0')) ||
              ((*(int *)(local_88 + 0x4c) != 3 &&
               (iVar7 = (*local_d0->_vptr_Reflection[5])(local_d0,message), (char)iVar7 != '\0')))))
             ) {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"Non-repeated Any specified multiple times.","");
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        &local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            goto LAB_00332e6f;
          }
          std::operator+(&local_c8,&local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148);
          (*local_d0->_vptr_Reflection[0x24])(local_d0,message,local_80,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          bVar5 = true;
          (*local_d0->_vptr_Reflection[0x24])(local_d0,message,local_88,&local_f0);
        }
        else {
LAB_00332e6f:
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_00332fbc:
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      goto LAB_00333f80;
    }
  }
  local_148._0_8_ = local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"[","");
  bVar5 = TryConsume(this,(string *)local_148);
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (bVar5) {
    bVar5 = ConsumeFullTypeName(this,&local_a8);
    if (bVar5) {
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"]","");
      bVar5 = Consume(this,(string *)local_148);
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      if (bVar5) {
        pFVar2 = this->finder_;
        if (pFVar2 == (Finder *)0x0) {
          iVar7 = (*local_d0->_vptr_Reflection[0x4d])(local_d0,&local_a8);
          this_02 = (FieldDescriptor *)CONCAT44(extraout_var_04,iVar7);
        }
        else {
          iVar7 = (*pFVar2->_vptr_Finder[2])(pFVar2,message,&local_a8);
          this_02 = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar7);
        }
        if (this_02 != (FieldDescriptor *)0x0) goto LAB_003332c5;
        if (this->allow_unknown_field_ != false) {
          std::operator+(&local_c8,"Extension \"",&local_a8);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          puVar14 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_f0.field_2._M_allocated_capacity = *puVar14;
            local_f0.field_2._8_8_ = plVar10[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *puVar14;
            local_f0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_f0._M_string_length = plVar10[1];
          *plVar10 = (long)puVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::operator+(&local_110,&local_f0,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (this_00 + 8));
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_148._0_8_ = local_148 + 0x10;
          puVar14 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar14) {
            local_148._16_8_ = *puVar14;
            local_148._24_8_ = plVar10[3];
          }
          else {
            local_148._16_8_ = *puVar14;
            local_148._0_8_ = (ulong *)*plVar10;
          }
          local_148._8_8_ = plVar10[1];
          *plVar10 = (long)puVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_148);
          if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
            operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_00333ad8:
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
LAB_00333ae5:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (this->allow_unknown_field_ == false) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                       ,0x1d9);
            other = internal::LogMessage::operator<<
                              ((LogMessage *)local_148,"CHECK failed: allow_unknown_field_: ");
            internal::LogFinisher::operator=((LogFinisher *)&local_110,other);
            internal::LogMessage::~LogMessage((LogMessage *)local_148);
          }
          local_148._0_8_ = local_148 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_148,":","");
          bVar5 = TryConsume(this,(string *)local_148);
          if (bVar5) {
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"{","");
            _Var18._M_p = local_110._M_dataplus._M_p;
            sVar3 = (this->tokenizer_).current_.text._M_string_length;
            if ((sVar3 == local_110._M_string_length) &&
               ((sVar3 == 0 ||
                (iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                              local_110._M_dataplus._M_p,sVar3), iVar7 == 0)))) {
              bVar5 = false;
            }
            else {
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"<","");
              _Var4._M_p = local_f0._M_dataplus._M_p;
              sVar3 = (this->tokenizer_).current_.text._M_string_length;
              if (sVar3 == local_f0._M_string_length) {
                if (sVar3 == 0) {
                  bVar5 = false;
                }
                else {
                  iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                               local_f0._M_dataplus._M_p,sVar3);
                  bVar5 = iVar7 != 0;
                }
              }
              else {
                bVar5 = true;
              }
              _Var18._M_p = local_110._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var4._M_p != &local_f0.field_2) {
                operator_delete(_Var4._M_p,local_f0.field_2._M_allocated_capacity + 1);
                _Var18._M_p = local_110._M_dataplus._M_p;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var18._M_p != &local_110.field_2) {
              operator_delete(_Var18._M_p,local_110.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar5 = false;
          }
          if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
            operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
          }
          if (bVar5) {
            bVar5 = SkipFieldValue(this);
          }
          else {
            bVar5 = SkipFieldMessage(this);
          }
          goto LAB_00333f80;
        }
        std::operator+(&local_c8,"Extension \"",&local_a8);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        puVar14 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_f0.field_2._M_allocated_capacity = *puVar14;
          local_f0.field_2._8_8_ = puVar12[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *puVar14;
          local_f0._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_f0._M_string_length = puVar12[1];
        *puVar12 = puVar14;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::operator+(&local_110,&local_f0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (this_00 + 8));
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_148._0_8_ = local_148 + 0x10;
        puVar14 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar14) {
          local_148._16_8_ = *puVar14;
          local_148._24_8_ = plVar10[3];
        }
        else {
          local_148._16_8_ = *puVar14;
          local_148._0_8_ = (ulong *)*plVar10;
        }
        local_148._8_8_ = plVar10[1];
        *plVar10 = (long)puVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_148);
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_00333c92:
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
LAB_00333c9f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        local_50.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
        local_50._M_dataplus._M_p = local_c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) goto LAB_00333f76;
      }
    }
  }
  else {
    bVar5 = ConsumeIdentifier(this,&local_a8);
    if (!bVar5) goto LAB_00333f7e;
    if ((this->allow_field_number_ == true) &&
       (bVar5 = safe_strto32(&local_a8,(int32 *)&local_78), bVar5)) {
      pEVar9 = Descriptor::FindExtensionRangeContainingNumber
                         (this_00,(int)local_78._M_dataplus._M_p);
      if (pEVar9 == (ExtensionRange *)0x0) {
        this_02 = Descriptor::FindFieldByNumber(this_00,(int)local_78._M_dataplus._M_p);
      }
      else {
        iVar7 = (*local_d0->_vptr_Reflection[0x4e])();
        this_02 = (FieldDescriptor *)CONCAT44(extraout_var_03,iVar7);
      }
LAB_003332bc:
      if (this_02 == (FieldDescriptor *)0x0) {
LAB_003336ec:
        if (this->allow_unknown_field_ != false) {
          std::operator+(&local_c8,"Message type \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (this_00 + 8));
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          puVar14 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_f0.field_2._M_allocated_capacity = *puVar14;
            local_f0.field_2._8_8_ = puVar12[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *puVar14;
            local_f0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_f0._M_string_length = puVar12[1];
          *puVar12 = puVar14;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_f0,(ulong)local_a8._M_dataplus._M_p);
          puVar14 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_110.field_2._M_allocated_capacity = *puVar14;
            local_110.field_2._8_8_ = plVar10[3];
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          }
          else {
            local_110.field_2._M_allocated_capacity = *puVar14;
            local_110._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_110._M_string_length = plVar10[1];
          *plVar10 = (long)puVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_148._0_8_ = local_148 + 0x10;
          puVar14 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar14) {
            local_148._16_8_ = *puVar14;
            local_148._24_8_ = plVar10[3];
          }
          else {
            local_148._16_8_ = *puVar14;
            local_148._0_8_ = (ulong *)*plVar10;
          }
          local_148._8_8_ = plVar10[1];
          *plVar10 = (long)puVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_148);
          if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
            operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_00333ad8;
          goto LAB_00333ae5;
        }
        std::operator+(&local_c8,"Message type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (this_00 + 8));
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        puVar14 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_f0.field_2._M_allocated_capacity = *puVar14;
          local_f0.field_2._8_8_ = puVar12[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *puVar14;
          local_f0._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_f0._M_string_length = puVar12[1];
        *puVar12 = puVar14;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_f0,(ulong)local_a8._M_dataplus._M_p);
        puVar14 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_110.field_2._M_allocated_capacity = *puVar14;
          local_110.field_2._8_8_ = puVar12[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *puVar14;
          local_110._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_110._M_string_length = puVar12[1];
        *puVar12 = puVar14;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_148._0_8_ = local_148 + 0x10;
        puVar14 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar14) {
          local_148._16_8_ = *puVar14;
          local_148._24_8_ = plVar10[3];
        }
        else {
          local_148._16_8_ = *puVar14;
          local_148._0_8_ = (ulong *)*plVar10;
        }
        local_148._8_8_ = plVar10[1];
        *plVar10 = (long)puVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_148);
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_00333c92;
        goto LAB_00333c9f;
      }
    }
    else {
      this_02 = Descriptor::FindFieldByName(this_00,&local_a8);
      if (this_02 == (FieldDescriptor *)0x0) {
        local_148._0_8_ = local_148 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_148,local_a8._M_dataplus._M_p,
                   local_a8._M_dataplus._M_p + local_a8._M_string_length);
        if ((char *)local_148._8_8_ != (char *)0x0) {
          pcVar16 = (char *)0x0;
          do {
            if ((byte)(*(byte *)(local_148._0_8_ + (long)pcVar16) + 0xbf) < 0x1a) {
              *(byte *)(local_148._0_8_ + (long)pcVar16) =
                   *(byte *)(local_148._0_8_ + (long)pcVar16) | 0x20;
            }
            pcVar16 = pcVar16 + 1;
          } while ((char *)local_148._8_8_ != pcVar16);
        }
        this_01 = Descriptor::FindFieldByName(this_00,(string *)local_148);
        if (this_01 == (FieldDescriptor *)0x0) {
          this_02 = (FieldDescriptor *)0x0;
        }
        else {
          TVar8 = FieldDescriptor::type(this_01);
          this_02 = (FieldDescriptor *)0x0;
          if (TVar8 == TYPE_GROUP) {
            this_02 = this_01;
          }
        }
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if (this_02 != (FieldDescriptor *)0x0) goto LAB_003331de;
LAB_00333229:
        if (this->allow_case_insensitive_field_ == true) {
          local_148._0_8_ = local_148 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_148,local_a8._M_dataplus._M_p,
                     local_a8._M_dataplus._M_p + local_a8._M_string_length);
          if ((char *)local_148._8_8_ != (char *)0x0) {
            pcVar16 = (char *)0x0;
            do {
              if ((byte)(*(byte *)(local_148._0_8_ + (long)pcVar16) + 0xbf) < 0x1a) {
                *(byte *)(local_148._0_8_ + (long)pcVar16) =
                     *(byte *)(local_148._0_8_ + (long)pcVar16) | 0x20;
              }
              pcVar16 = pcVar16 + 1;
            } while ((char *)local_148._8_8_ != pcVar16);
          }
          this_02 = Descriptor::FindFieldByLowercaseName(this_00,(string *)local_148);
          if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
            operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
          }
          goto LAB_003332bc;
        }
        goto LAB_003336ec;
      }
LAB_003331de:
      TVar8 = FieldDescriptor::type(this_02);
      if (TVar8 == TYPE_GROUP) {
        pDVar11 = FieldDescriptor::message_type(this_02);
        sVar3 = (*(undefined8 **)pDVar11)[1];
        if ((sVar3 != local_a8._M_string_length) ||
           ((sVar3 != 0 &&
            (iVar7 = bcmp((void *)**(undefined8 **)pDVar11,local_a8._M_dataplus._M_p,sVar3),
            iVar7 != 0)))) goto LAB_00333229;
      }
    }
LAB_003332c5:
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      if ((*(int *)(this_02 + 0x4c) == 3) ||
         (iVar7 = (*local_d0->_vptr_Reflection[5])(local_d0,message,this_02), (char)iVar7 == '\0'))
      {
        puVar12 = *(undefined8 **)(this_02 + 0x60);
        if ((puVar12 == (undefined8 *)0x0) ||
           (iVar7 = (*local_d0->_vptr_Reflection[8])(local_d0,message,puVar12), (char)iVar7 == '\0')
           ) goto LAB_003333e2;
        iVar7 = (*local_d0->_vptr_Reflection[10])(local_d0,message,puVar12);
        std::operator+(&local_50,"Field \"",&local_a8);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar15 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_78.field_2._M_allocated_capacity = *psVar15;
          local_78.field_2._8_8_ = plVar10[3];
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        }
        else {
          local_78.field_2._M_allocated_capacity = *psVar15;
          local_78._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_78._M_string_length = plVar10[1];
        *plVar10 = (long)psVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::operator+(&local_c8,&local_78,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        CONCAT44(extraout_var_05,iVar7));
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
        puVar14 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_f0.field_2._M_allocated_capacity = *puVar14;
          local_f0.field_2._8_8_ = puVar13[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *puVar14;
          local_f0._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_f0._M_string_length = puVar13[1];
        *puVar13 = puVar14;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::operator+(&local_110,&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar12
                      );
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_148._0_8_ = local_148 + 0x10;
        puVar14 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar14) {
          local_148._16_8_ = *puVar14;
          local_148._24_8_ = plVar10[3];
        }
        else {
          local_148._16_8_ = *puVar14;
          local_148._0_8_ = (ulong *)*plVar10;
        }
        local_148._8_8_ = plVar10[1];
        *plVar10 = (long)puVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_148);
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00333f76;
      }
      else {
        std::operator+(&local_110,"Non-repeated field \"",&local_a8);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
        puVar14 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar14) {
          local_148._16_8_ = *puVar14;
          local_148._24_8_ = plVar10[3];
          local_148._0_8_ = local_148 + 0x10;
        }
        else {
          local_148._16_8_ = *puVar14;
          local_148._0_8_ = (ulong *)*plVar10;
        }
        local_148._8_8_ = plVar10[1];
        *plVar10 = (long)puVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_148);
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        local_50.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
        local_50._M_dataplus._M_p = local_110._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_00333f76:
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
LAB_003333e2:
      TVar8 = FieldDescriptor::type(this_02);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar8 * 4) == 10) {
        local_148._0_8_ = local_148 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_148,":","");
        bVar5 = TryConsume(this,(string *)local_148);
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if (((!bVar5) || (*(char *)(*(long *)(this_02 + 0x80) + 0x6f) != '\x01')) ||
           ((this->tokenizer_).current_.type != TYPE_STRING)) goto LAB_00333525;
        local_148._0_8_ = local_148 + 0x10;
        local_148._8_8_ = (char *)0x0;
        local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
        bVar5 = ConsumeString(this,(string *)local_148);
        if (bVar5) {
          iVar7 = (*local_d0->_vptr_Reflection[0x27])(local_d0,message,this_02,0);
          MessageLite::ParseFromString
                    ((MessageLite *)CONCAT44(extraout_var_06,iVar7),(string *)local_148);
        }
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if (!bVar5) goto LAB_00333f7e;
LAB_0033376e:
        local_148._0_8_ = local_148 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_148,";","");
        bVar5 = TryConsume(this,(string *)local_148);
        if (!bVar5) {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,",","");
          TryConsume(this,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
        puVar14 = (ulong *)(local_148 + 0x10);
        if ((ulong *)local_148._0_8_ != puVar14) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if (*(char *)(*(long *)(this_02 + 0x80) + 0x6e) == '\x01') {
          std::operator+(&local_110,"text format contains deprecated field \"",&local_a8);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
          puVar17 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar17) {
            local_148._16_8_ = *puVar17;
            local_148._24_8_ = plVar10[3];
            local_148._0_8_ = puVar14;
          }
          else {
            local_148._16_8_ = *puVar17;
            local_148._0_8_ = (ulong *)*plVar10;
          }
          local_148._8_8_ = plVar10[1];
          *plVar10 = (long)puVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_148);
          if ((ulong *)local_148._0_8_ != puVar14) {
            operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
        bVar5 = true;
        if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
          ParseInfoTree::RecordLocation(this->parse_info_tree_,this_02,local_58);
        }
        goto LAB_00333f80;
      }
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,":","");
      bVar5 = Consume(this,(string *)local_148);
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      if (bVar5) {
LAB_00333525:
        if (*(int *)(this_02 + 0x4c) == 3) {
          local_148._0_8_ = local_148 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"[","");
          bVar5 = TryConsume(this,(string *)local_148);
          if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
            operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
          }
          if (bVar5) {
            local_148._0_8_ = local_148 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"]","");
            bVar5 = TryConsume(this,(string *)local_148);
            if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
              operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
            }
            if (!bVar5) {
              do {
                TVar8 = FieldDescriptor::type(this_02);
                if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar8 * 4) == 10) {
                  bVar5 = ConsumeFieldMessage(this,message,local_d0,this_02);
                }
                else {
                  bVar5 = ConsumeFieldValue(this,message,local_d0,this_02);
                }
                if (bVar5 == false) goto LAB_00333f7e;
                local_148._0_8_ = local_148 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"]","");
                bVar5 = TryConsume(this,(string *)local_148);
                if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                  operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                }
                if (bVar5) goto LAB_0033376e;
                local_148._0_8_ = local_148 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_148,",","");
                bVar6 = Consume(this,(string *)local_148);
                if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                  operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                }
                bVar5 = false;
              } while (bVar6);
              goto LAB_00333f80;
            }
            goto LAB_0033376e;
          }
        }
        TVar8 = FieldDescriptor::type(this_02);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar8 * 4) == 10) {
          bVar5 = ConsumeFieldMessage(this,message,local_d0,this_02);
        }
        else {
          bVar5 = ConsumeFieldValue(this,message,local_d0,this_02);
        }
        if (bVar5 != false) goto LAB_0033376e;
      }
    }
  }
LAB_00333f7e:
  bVar5 = false;
LAB_00333f80:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    string field_name;

    const FieldDescriptor* field = NULL;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      string serialized_value;
      DO(ConsumeAnyValue(full_type_name,
                         message->GetDescriptor()->file()->pool(),
                         &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(
          message, any_type_url_field,
          string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = (finder_ != NULL
               ? finder_->FindExtension(message, field_name)
               : reflection->FindKnownExtensionByName(field_name));

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Extension \"" + field_name + "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Extension \"" + field_name + "\" is not defined or "
                        "is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ && safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = reflection->FindKnownExtensionByNumber(field_number);
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == NULL) {
          string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != NULL && field->type() != FieldDescriptor::TYPE_GROUP) {
            field = NULL;
          }
        }
        // Again, special-case group names as described above.
        if (field != NULL && field->type() == FieldDescriptor::TYPE_GROUP
            && field->message_type()->name() != field_name) {
          field = NULL;
        }

        if (field == NULL && allow_case_insensitive_field_) {
          string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }
      }

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown field.
    if (field == NULL) {
      GOOGLE_CHECK(allow_unknown_field_);
      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != NULL && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name + "\" is specified along with "
                    "field \"" + other_field->name() + "\", another member "
                    "of oneof \"" + oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() && LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        string tmp;
        DO(ConsumeString(&tmp));
        reflection->MutableMessage(message, field)->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \""
                    + field_name + "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != NULL) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }